

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

target_ulong_conflict
helper_divweu_ppc(CPUPPCState_conflict *env,target_ulong_conflict ra,target_ulong_conflict rb,
                 uint32_t oe)

{
  bool bVar1;
  target_ulong_conflict tVar2;
  ulong uVar3;
  
  if (rb == 0) {
    bVar1 = false;
    uVar3 = 0;
  }
  else {
    uVar3 = ((ulong)ra << 0x20) / (ulong)rb;
    bVar1 = uVar3 >> 0x20 == 0;
  }
  tVar2 = (target_ulong_conflict)uVar3;
  if (!bVar1) {
    tVar2 = 0;
  }
  if (oe != 0) {
    if (!bVar1) {
      env->so = 1;
      env->ov = 1;
      return tVar2;
    }
    env->ov = 0;
  }
  return tVar2;
}

Assistant:

target_ulong helper_divweu(CPUPPCState *env, target_ulong ra, target_ulong rb,
                           uint32_t oe)
{
    uint64_t rt = 0;
    int overflow = 0;

    uint64_t dividend = (uint64_t)ra << 32;
    uint64_t divisor = (uint32_t)rb;

    if (unlikely(divisor == 0)) {
        overflow = 1;
    } else {
        rt = dividend / divisor;
        overflow = rt > UINT32_MAX;
    }

    if (unlikely(overflow)) {
        rt = 0; /* Undefined */
    }

    if (oe) {
        helper_update_ov_legacy(env, overflow);
    }

    return (target_ulong)rt;
}